

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O3

bool __thiscall QSslContext::cacheSession(QSslContext *this,SSL *ssl)

{
  Data *pDVar1;
  char cVar2;
  int iVar3;
  SSL_SESSION *pSVar4;
  SSL_SESSION *pSVar5;
  QSslContext *this_00;
  unsigned_long uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  uchar *data;
  uchar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar5 = this->session;
  if (pSVar5 != (SSL_SESSION *)0x0) {
    pSVar4 = q_SSL_get_session(ssl);
    if (pSVar5 == pSVar4) {
      bVar7 = true;
      goto LAB_0012bee0;
    }
    if (this->session != (SSL_SESSION *)0x0) {
      q_SSL_SESSION_free(this->session);
    }
  }
  pSVar5 = q_SSL_get1_session(ssl);
  this->session = pSVar5;
  if (pSVar5 != (SSL_SESSION *)0x0) {
    cVar2 = QSslConfiguration::testSslOption
                      ((int)this +
                       (SslOptionDisableSessionPersistence|SslOptionDisableLegacyRenegotiation));
    if (cVar2 == '\0') {
      iVar3 = q_i2d_SSL_SESSION(this->session,(uchar **)0x0);
      if (0 < iVar3) {
        QByteArray::resize((longlong)&this->m_sessionASN1);
        pDVar1 = (this->m_sessionASN1).d.d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData
                    ((longlong)&this->m_sessionASN1,(AllocationOption)(this->m_sessionASN1).d.size);
        }
        local_28 = (uchar *)(this->m_sessionASN1).d.ptr;
        iVar3 = q_i2d_SSL_SESSION(this->session,&local_28);
        if (iVar3 == 0) {
          this_00 = (QSslContext *)lcTlsBackend();
          if (((ulong)this_00->session & 0x100) != 0) {
            cacheSession(this_00);
          }
        }
        uVar6 = q_SSL_SESSION_get_ticket_lifetime_hint(this->session);
        this->m_sessionTicketLifeTimeHint = (int)uVar6;
      }
    }
  }
  bVar7 = this->session != (SSL_SESSION *)0x0;
LAB_0012bee0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslContext::cacheSession(SSL* ssl)
{
    // don't cache the same session again
    if (session && session == q_SSL_get_session(ssl))
        return true;

    // decrease refcount of currently stored session
    // (this might happen if there are several concurrent handshakes in flight)
    if (session)
        q_SSL_SESSION_free(session);

    // cache the session the caller gave us and increase reference count
    session = q_SSL_get1_session(ssl);

    if (session && !sslConfiguration.testSslOption(QSsl::SslOptionDisableSessionPersistence)) {
        int sessionSize = q_i2d_SSL_SESSION(session, nullptr);
        if (sessionSize > 0) {
            m_sessionASN1.resize(sessionSize);
            unsigned char *data = reinterpret_cast<unsigned char *>(m_sessionASN1.data());
            if (!q_i2d_SSL_SESSION(session, &data))
                qCWarning(lcTlsBackend, "could not store persistent version of SSL session");
            m_sessionTicketLifeTimeHint = q_SSL_SESSION_get_ticket_lifetime_hint(session);
        }
    }

    return (session != nullptr);
}